

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters::SerializeWithCachedSizes
          (TreeEnsembleParameters *this,CodedOutputStream *output)

{
  uint uVar1;
  int iVar2;
  TreeEnsembleParameters_TreeNode *value;
  uint64 uVar3;
  RepeatedField<double> *this_00;
  double *a;
  uint local_20;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  TreeEnsembleParameters *this_local;
  
  local_20 = 0;
  uVar1 = nodes_size(this);
  for (; local_20 < uVar1; local_20 = local_20 + 1) {
    value = nodes(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  uVar3 = numpredictiondimensions(this);
  if (uVar3 != 0) {
    uVar3 = numpredictiondimensions(this);
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,uVar3,output);
  }
  iVar2 = basepredictionvalue_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(3,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_basepredictionvalue_cached_byte_size_);
    this_00 = basepredictionvalue(this);
    a = google::protobuf::RepeatedField<double>::data(this_00);
    iVar2 = basepredictionvalue_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(a,iVar2,output);
  }
  return;
}

Assistant:

void TreeEnsembleParameters::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  for (unsigned int i = 0, n = this->nodes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->nodes(i), output);
  }

  // uint64 numPredictionDimensions = 2;
  if (this->numpredictiondimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->numpredictiondimensions(), output);
  }

  // repeated double basePredictionValue = 3;
  if (this->basepredictionvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_basepredictionvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->basepredictionvalue().data(), this->basepredictionvalue_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters)
}